

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

complex<long_double> *
TPZMatrix<std::complex<long_double>_>::ReturnNearestValue
          (complex<long_double> *__return_storage_ptr__,complex<long_double> val,
          TPZVec<std::complex<long_double>_> *Vec,complex<long_double> tol)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  complex<long_double> *pcVar5;
  longdouble *plVar6;
  long lVar7;
  long lVar8;
  longdouble in_ST0;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble lVar12;
  longdouble in_ST1;
  longdouble lVar13;
  longdouble in_ST2;
  longdouble lVar14;
  longdouble lVar15;
  longdouble lVar16;
  complex<long_double> diff0;
  undefined8 local_c8;
  undefined2 uStack_c0;
  undefined6 uStack_be;
  undefined8 local_b8;
  undefined2 uStack_b0;
  undefined6 uStack_ae;
  unkbyte10 local_a0;
  unkbyte10 local_94;
  longdouble local_88;
  longdouble local_7c;
  longdouble local_70;
  longdouble local_64;
  longdouble local_58;
  undefined4 uStack_4e;
  undefined2 uStack_4a;
  longdouble local_48;
  undefined4 uStack_3e;
  undefined2 uStack_3a;
  
  lVar10 = in_ST2;
  lVar14 = in_ST2;
  lVar12 = in_ST2;
  local_88 = val._M_value._16_10_;
  local_7c = val._M_value._0_10_;
  cabsl();
  local_94 = tol._M_value._0_10_;
  local_a0 = tol._M_value._16_10_;
  lVar15 = lVar12;
  cabsl();
  if (ABS(in_ST1) <= ABS(in_ST0)) {
    pcVar5 = Vec->fStore;
    uStack_be = val._M_value._10_6_;
    uStack_ae = val._M_value._26_6_;
    lVar11 = val._M_value._0_10_ - *(longdouble *)pcVar5->_M_value;
    lVar13 = val._M_value._16_10_ - *(longdouble *)(pcVar5->_M_value + 0x10);
    local_c8 = SUB108(lVar11,0);
    uStack_c0 = (undefined2)((unkuint10)lVar11 >> 0x40);
    local_b8 = SUB108(lVar13,0);
    uStack_b0 = (undefined2)((unkuint10)lVar13 >> 0x40);
  }
  else {
    local_c8 = SUB108((longdouble)1e+10,0);
    uStack_c0 = (undefined2)((unkuint10)(longdouble)1e+10 >> 0x40);
    local_b8 = SUB108((longdouble)0,0);
    uStack_b0 = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
    pcVar5 = Vec->fStore;
  }
  uVar2 = *(undefined8 *)pcVar5->_M_value;
  uVar3 = *(undefined8 *)(pcVar5->_M_value + 8);
  uVar4 = *(undefined8 *)(pcVar5->_M_value + 0x18);
  *(undefined8 *)(__return_storage_ptr__->_M_value + 0x10) =
       *(undefined8 *)(pcVar5->_M_value + 0x10);
  *(undefined8 *)(__return_storage_ptr__->_M_value + 0x18) = uVar4;
  *(undefined8 *)__return_storage_ptr__->_M_value = uVar2;
  *(undefined8 *)(__return_storage_ptr__->_M_value + 8) = uVar3;
  if (1 < Vec->fNElements) {
    lVar8 = 1;
    lVar7 = 0;
    do {
      uStack_4a = val._M_value._14_2_;
      uStack_4e = val._M_value._10_4_;
      uStack_3a = val._M_value._30_2_;
      uStack_3e = val._M_value._26_4_;
      local_64 = local_7c - *(longdouble *)(Vec->fStore[1]._M_value + lVar7);
      local_70 = local_88 - *(longdouble *)(Vec->fStore[1]._M_value + lVar7 + 0x10);
      lVar13 = lVar15;
      lVar11 = lVar15;
      lVar16 = lVar15;
      local_58 = local_64;
      local_48 = local_70;
      cabsl();
      lVar9 = ABS(in_ST2);
      in_ST2 = lVar14;
      lVar14 = lVar15;
      lVar15 = lVar11;
      cabsl();
      lVar11 = ABS(lVar10);
      plVar6 = (longdouble *)&local_c8;
      lVar10 = lVar12;
      if (lVar11 <= lVar9) {
        lVar10 = lVar13;
        lVar13 = lVar16;
        cabsl();
        lVar11 = ABS(in_ST2);
        in_ST2 = lVar14;
        lVar14 = lVar15;
        lVar15 = lVar16;
        cabsl();
        if (lVar11 < ABS(lVar12)) {
          puVar1 = (undefined8 *)(Vec->fStore[1]._M_value + lVar7);
          uVar2 = *puVar1;
          uVar3 = puVar1[1];
          puVar1 = (undefined8 *)(Vec->fStore[1]._M_value + lVar7 + 0x10);
          uVar4 = puVar1[1];
          *(undefined8 *)(__return_storage_ptr__->_M_value + 0x10) = *puVar1;
          *(undefined8 *)(__return_storage_ptr__->_M_value + 0x18) = uVar4;
          *(undefined8 *)__return_storage_ptr__->_M_value = uVar2;
          *(undefined8 *)(__return_storage_ptr__->_M_value + 8) = uVar3;
          plVar6 = &local_58;
        }
      }
      local_c8 = *(undefined8 *)plVar6;
      local_b8 = *(undefined8 *)(plVar6 + 1);
      uStack_b0 = (undefined2)*(undefined8 *)((long)plVar6 + 0x18);
      uStack_ae = (undefined6)((ulong)*(undefined8 *)((long)plVar6 + 0x18) >> 0x10);
      uStack_c0 = (undefined2)*(undefined8 *)((long)plVar6 + 8);
      uStack_be = (undefined6)((ulong)*(undefined8 *)((long)plVar6 + 8) >> 0x10);
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x20;
      lVar12 = lVar13;
    } while (lVar8 < Vec->fNElements);
  }
  return __return_storage_ptr__;
}

Assistant:

TVar TPZMatrix<TVar>::ReturnNearestValue(TVar val, TPZVec<TVar>& Vec, TVar tol)
{
    TVar exps = val - (TVar)Vec[0];
    TVar diff0 = fabs(exps) >= fabs(tol) ?  (val - (TVar)Vec[0]) : (TVar)1.E10;
    TVar diff1, res = (TVar)Vec[0];
    for(int64_t i = 1; i < Vec.NElements(); i++)
    {
        diff1 = val - (TVar)Vec[i];
        diff0 = ( fabs(diff1) >= fabs(tol) && fabs(diff1) < fabs(diff0) ) ? res = Vec[i],diff1 : diff0;
    }
    return res;
}